

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void * prf_array_fit(void *id)

{
  void *pvVar1;
  void *in_RDI;
  void *unaff_retaddr;
  
  id_to_array(in_RDI);
  pvVar1 = prf_array_set_size(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  return pvVar1;
}

Assistant:

void *
prf_array_fit(void *id)
{
  return prf_array_set_size(id, id_to_array(id)->numelem);
}